

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintSExpression::handleSignature
          (PrintSExpression *this,Function *curr,bool printImplicitNames)

{
  HeapType *this_00;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  Shareability SVar4;
  size_t sVar5;
  ostream *poVar6;
  Type *pTVar7;
  size_t sVar8;
  undefined7 in_register_00000011;
  Index index;
  PrintSExpression *pPVar9;
  Signature SVar10;
  RecGroup local_68;
  Type *local_60;
  undefined4 local_54;
  undefined1 local_50 [8];
  Iterator __begin1;
  char local_31;
  
  local_54 = (undefined4)CONCAT71(in_register_00000011,printImplicitNames);
  local_50[0] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_50,1);
  poVar6 = this->o;
  Colors::outputColorCode(poVar6,"\x1b[31m");
  Colors::outputColorCode(poVar6,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"func ",5);
  Colors::outputColorCode(poVar6,"\x1b[0m");
  Name::print((Name *)curr,this->o);
  if ((this->currModule == (Module *)0x0) || (((this->currModule->features).features & 0x400) == 0))
  {
    local_50 = (undefined1  [8])(curr->type).id;
    bVar2 = HeapType::isOpen((HeapType *)local_50);
    if ((!bVar2) && (SVar4 = HeapType::getShared((HeapType *)local_50), SVar4 != Shared)) {
      local_68 = HeapType::getRecGroup((HeapType *)local_50);
      sVar5 = RecGroup::size(&local_68);
      if (sVar5 < 2) goto LAB_00a390f3;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o," (type ",7);
  poVar6 = printHeapTypeName(this,(HeapType)(curr->type).id);
  local_50[0] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_50,1);
LAB_00a390f3:
  this_00 = &curr->type;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = (size_t)this;
  SVar10 = HeapType::getSignature(this_00);
  local_68.id = (uintptr_t)SVar10.params.id;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_50 = (undefined1  [8])&local_68;
  pTVar7 = (Type *)wasm::Type::size((Type *)&local_68);
  pPVar9 = (PrintSExpression *)
           __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  if ((__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent != pTVar7
      ) || (local_50 != (undefined1  [8])&local_68)) {
    bVar2 = false;
    index = 0;
    do {
      local_60 = wasm::Type::Iterator::operator*((Iterator *)local_50);
      bVar3 = true;
      if ((char)local_54 == '\0') {
        bVar3 = Function::hasLocalName(curr,index);
      }
      if ((bVar3 == false) || (!bVar2)) {
        poVar6 = pPVar9->o;
        if (bVar2) {
          local_31 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_31,1);
        }
        else {
          pcVar1 = pPVar9->maybeSpace;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            pPVar9 = (PrintSExpression *)
                     __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
          }
          else {
            sVar8 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar8);
            pPVar9 = (PrintSExpression *)
                     __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
          }
        }
      }
      else {
        local_31 = ')';
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(pPVar9->o,&local_31,1);
        pcVar1 = pPVar9->maybeSpace;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar8);
        }
        bVar2 = false;
        pPVar9 = (PrintSExpression *)
                 __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      }
      if (!bVar2) {
        local_31 = '(';
        std::__ostream_insert<char,std::char_traits<char>>(pPVar9->o,&local_31,1);
        poVar6 = *(ostream **)
                  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
        ;
        Colors::outputColorCode(poVar6,"\x1b[33m");
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"param ",6);
        pPVar9 = (PrintSExpression *)
                 __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
        Colors::outputColorCode(poVar6,"\x1b[0m");
        bVar2 = true;
      }
      if (bVar3 == false) {
        printType(pPVar9,(Type)local_60->id);
      }
      else {
        anon_unknown_0::printLocal(index,pPVar9->currFunction,pPVar9->o);
        local_31 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(pPVar9->o,&local_31,1);
        printType((PrintSExpression *)
                  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  ,(Type)local_60->id);
        pPVar9 = (PrintSExpression *)
                 __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
        local_31 = ')';
        std::__ostream_insert<char,std::char_traits<char>>
                  (*(ostream **)
                    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,&local_31,1);
        bVar2 = false;
      }
      index = index + 1;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while ((__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar7) || (local_50 != (undefined1  [8])&local_68));
    if (bVar2) {
      local_50[0] = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(pPVar9->o,local_50,1);
    }
  }
  SVar10 = HeapType::getSignature(this_00);
  if (SVar10.results.id.id != 0) {
    poVar6 = pPVar9->o;
    pcVar1 = pPVar9->maybeSpace;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,sVar8);
    }
    SVar10 = HeapType::getSignature(this_00);
    printPrefixedTypes((PrintSExpression *)
                       __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index,"result",SVar10.results.id);
  }
  return;
}

Assistant:

void PrintSExpression::handleSignature(Function* curr,
                                       bool printImplicitNames) {
  o << '(';
  printMajor(o, "func ");
  curr->name.print(o);
  if ((currModule && currModule->features.hasGC()) ||
      requiresExplicitFuncType(curr->type)) {
    o << " (type ";
    printHeapTypeName(curr->type) << ')';
  }
  bool inParam = false;
  Index i = 0;
  for (const auto& param : curr->getParams()) {
    auto hasName = printImplicitNames || curr->hasLocalName(i);
    if (hasName && inParam) {
      o << ')' << maybeSpace;
      inParam = false;
    } else if (inParam) {
      o << ' ';
    } else {
      o << maybeSpace;
    }
    if (!inParam) {
      o << '(';
      printMinor(o, "param ");
      inParam = true;
    }
    if (hasName) {
      printLocal(i, currFunction, o);
      o << ' ';
    }
    printType(param);
    if (hasName) {
      o << ')';
      inParam = false;
    }
    ++i;
  }
  if (inParam) {
    o << ')';
  }
  if (curr->getResults() != Type::none) {
    o << maybeSpace;
    printResultType(curr->getResults());
  }
}